

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O0

_Bool cs_insn_group(csh ud,cs_insn *insn,uint group_id)

{
  uint in_EDX;
  int *in_RSI;
  long in_RDI;
  cs_struct *handle;
  _Bool local_1;
  
  if (in_RDI == 0) {
    local_1 = false;
  }
  else if (*(int *)(in_RDI + 0x60) == 0) {
    *(undefined4 *)(in_RDI + 0x50) = 7;
    local_1 = false;
  }
  else if (*in_RSI == 0) {
    *(undefined4 *)(in_RDI + 0x50) = 0xb;
    local_1 = false;
  }
  else if (*(long *)(in_RSI + 0x3c) == 0) {
    *(undefined4 *)(in_RDI + 0x50) = 7;
    local_1 = false;
  }
  else {
    local_1 = arr_exist8((uchar *)(*(long *)(in_RSI + 0x3c) + 0x4b),
                         *(uchar *)(*(long *)(in_RSI + 0x3c) + 0x53),in_EDX);
  }
  return local_1;
}

Assistant:

CAPSTONE_API cs_insn_group(csh ud, const cs_insn *insn, unsigned int group_id)
{
	struct cs_struct *handle;
	if (!ud)
		return false;

	handle = (struct cs_struct *)(uintptr_t)ud;

	if (!handle->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return false;
	}

	if (!insn->id) {
		handle->errnum = CS_ERR_SKIPDATA;
		return false;
	}

	if (!insn->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return false;
	}

	return arr_exist8(insn->detail->groups, insn->detail->groups_count, group_id);
}